

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O2

bool __thiscall cmCPackGenerator::WantsComponentInstallation(cmCPackGenerator *this)

{
  bool bVar1;
  int iVar2;
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"CPACK_MONOLITHIC_INSTALL",&local_39);
  bVar1 = IsOn(this,&local_38);
  if (!bVar1) {
    iVar2 = (*(this->super_cmObject)._vptr_cmObject[0x17])(this);
    if ((char)iVar2 != '\0') {
      bVar1 = true;
      if ((this->ComponentGroups)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        bVar1 = (this->Components)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0;
      }
      goto LAB_00285af4;
    }
  }
  bVar1 = false;
LAB_00285af4:
  std::__cxx11::string::~string((string *)&local_38);
  return bVar1;
}

Assistant:

bool cmCPackGenerator::WantsComponentInstallation() const
{
  return (!IsOn("CPACK_MONOLITHIC_INSTALL")
        && SupportsComponentInstallation()
        // check that we have at least one group or component
        && (!this->ComponentGroups.empty() || !this->Components.empty()));
}